

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall
google::protobuf::DescriptorProto_ExtensionRange::ByteSizeLong(DescriptorProto_ExtensionRange *this)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = (this->_has_bits_).has_bits_[0];
  if ((uVar4 & 7) == 0) {
    sVar2 = 0;
  }
  else {
    if ((uVar4 & 1) == 0) {
      sVar2 = 0;
    }
    else {
      sVar2 = ExtensionRangeOptions::ByteSizeLong(this->options_);
      uVar3 = (uint)sVar2 | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar2 = sVar2 + (iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 2) != 0) {
      if (this->start_ < 0) {
        uVar5 = 0xb;
      }
      else {
        uVar3 = this->start_ | 1;
        iVar1 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
          }
        }
        uVar5 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
      }
      sVar2 = sVar2 + uVar5;
    }
    if ((uVar4 & 4) != 0) {
      if (this->end_ < 0) {
        uVar5 = 0xb;
      }
      else {
        uVar4 = this->end_ | 1;
        iVar1 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
          }
        }
        uVar5 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
      }
      sVar2 = sVar2 + uVar5;
    }
  }
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict2)sVar2;
    return sVar2;
  }
  sVar2 = internal::ComputeUnknownFieldsSize
                    (&(this->super_Message).super_MessageLite._internal_metadata_,sVar2,
                     &this->_cached_size_);
  return sVar2;
}

Assistant:

size_t DescriptorProto_ExtensionRange::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.DescriptorProto.ExtensionRange)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000007u) {
    // optional .google.protobuf.ExtensionRangeOptions options = 3;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

    // optional int32 start = 1;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_start());
    }

    // optional int32 end = 2;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_end());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}